

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O1

void __thiscall OpenMD::Electrostatic::calcForce(Electrostatic *this,InteractionData *idat)

{
  RealType *t;
  RealType *__s;
  pointer pEVar1;
  pointer pEVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer piVar7;
  pointer pEVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  ulong uVar12;
  double dVar13;
  RealType RVar14;
  RealType RVar15;
  RealType RVar16;
  RealType RVar17;
  undefined8 uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined3 uVar23;
  int iVar24;
  undefined4 uVar25;
  uint i_4;
  Mat3x3d *pMVar26;
  Mat3x3d *pMVar27;
  uint i_14;
  long lVar28;
  ulong uVar29;
  uint i_2;
  long lVar30;
  Mat3x3d *pMVar31;
  long lVar32;
  uint j_7;
  double (*padVar33) [3];
  uint k;
  long lVar34;
  double tmp;
  double tmp_1;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double tmp_7;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_8;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result_10;
  Vector<double,_3U> result_14;
  Vector<double,_3U> result_13;
  double local_178 [4];
  double local_158 [4];
  double local_138 [10];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [3];
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar7 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar28 = (long)piVar7[idat->atid1];
  if (lVar28 == -1) {
    this->a_uses_SlaterIntra = false;
    this->a_is_Charge = false;
    this->a_is_Dipole = false;
    this->a_is_Quadrupole = false;
    this->a_is_Fluctuating = false;
  }
  else {
    pEVar8 = (this->ElectrostaticMap).
             super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar8 + lVar28;
    pEVar2 = pEVar8 + lVar28;
    bVar19 = pEVar2->is_Dipole;
    bVar20 = pEVar2->is_Quadrupole;
    bVar21 = pEVar2->is_Fluctuating;
    bVar22 = pEVar2->uses_SlaterIntramolecular;
    uVar23 = *(undefined3 *)&pEVar2->field_0x5;
    RVar14 = pEVar2->fixedCharge;
    RVar15 = pEVar8[lVar28].hardness;
    RVar16 = (&pEVar8[lVar28].hardness)[1];
    pEVar8 = pEVar8 + lVar28;
    iVar24 = pEVar8->slaterN;
    uVar25 = *(undefined4 *)&pEVar8->field_0x24;
    RVar17 = *(RealType *)(&pEVar8->slaterN + 2);
    (this->data1).is_Charge = pEVar2->is_Charge;
    (this->data1).is_Dipole = bVar19;
    (this->data1).is_Quadrupole = bVar20;
    (this->data1).is_Fluctuating = bVar21;
    (this->data1).uses_SlaterIntramolecular = bVar22;
    *(undefined3 *)&(this->data1).field_0x5 = uVar23;
    (this->data1).fixedCharge = RVar14;
    (this->data1).hardness = RVar15;
    (this->data1).electronegativity = RVar16;
    (this->data1).slaterN = iVar24;
    *(undefined4 *)&(this->data1).field_0x24 = uVar25;
    (this->data1).slaterZeta = RVar17;
    if (&this->data1 != pEVar1) {
      lVar28 = 0;
      do {
        (this->data1).dipole.super_Vector<double,_3U>.data_[lVar28] =
             *(double *)((long)(pEVar1->dipole).super_Vector<double,_3U>.data_ + lVar28 * 8);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
    if (&this->data1 != pEVar1) {
      pMVar27 = &(this->data1).quadrupole;
      pMVar26 = &pEVar1->quadrupole;
      lVar28 = 0;
      do {
        lVar32 = 0;
        do {
          (pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar32]
               = *(double *)
                  ((long)(pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + lVar32 * 8);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 3);
        lVar28 = lVar28 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
        pMVar26 = (Mat3x3d *)
                  ((long)(pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 0x18);
      } while (lVar28 != 3);
    }
    bVar19 = (this->data1).is_Dipole;
    bVar20 = (this->data1).is_Quadrupole;
    bVar21 = (this->data1).is_Fluctuating;
    this->a_is_Charge = (this->data1).is_Charge;
    this->a_is_Dipole = bVar19;
    this->a_is_Quadrupole = bVar20;
    this->a_is_Fluctuating = bVar21;
    this->a_uses_SlaterIntra = (this->data1).uses_SlaterIntramolecular;
  }
  lVar28 = (long)piVar7[idat->atid2];
  if (lVar28 == -1) {
    this->b_uses_SlaterIntra = false;
    this->b_is_Charge = false;
    this->b_is_Dipole = false;
    this->b_is_Quadrupole = false;
    this->b_is_Fluctuating = false;
  }
  else {
    pEVar8 = (this->ElectrostaticMap).
             super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar8 + lVar28;
    pEVar2 = pEVar8 + lVar28;
    bVar19 = pEVar2->is_Dipole;
    bVar20 = pEVar2->is_Quadrupole;
    bVar21 = pEVar2->is_Fluctuating;
    bVar22 = pEVar2->uses_SlaterIntramolecular;
    uVar23 = *(undefined3 *)&pEVar2->field_0x5;
    RVar14 = pEVar2->fixedCharge;
    RVar15 = pEVar8[lVar28].hardness;
    RVar16 = (&pEVar8[lVar28].hardness)[1];
    pEVar8 = pEVar8 + lVar28;
    iVar24 = pEVar8->slaterN;
    uVar25 = *(undefined4 *)&pEVar8->field_0x24;
    RVar17 = *(RealType *)(&pEVar8->slaterN + 2);
    (this->data2).is_Charge = pEVar2->is_Charge;
    (this->data2).is_Dipole = bVar19;
    (this->data2).is_Quadrupole = bVar20;
    (this->data2).is_Fluctuating = bVar21;
    (this->data2).uses_SlaterIntramolecular = bVar22;
    *(undefined3 *)&(this->data2).field_0x5 = uVar23;
    (this->data2).fixedCharge = RVar14;
    (this->data2).hardness = RVar15;
    (this->data2).electronegativity = RVar16;
    (this->data2).slaterN = iVar24;
    *(undefined4 *)&(this->data2).field_0x24 = uVar25;
    (this->data2).slaterZeta = RVar17;
    if (&this->data2 != pEVar1) {
      lVar28 = 0;
      do {
        (this->data2).dipole.super_Vector<double,_3U>.data_[lVar28] =
             *(double *)((long)(pEVar1->dipole).super_Vector<double,_3U>.data_ + lVar28 * 8);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
    if (&this->data2 != pEVar1) {
      pMVar27 = &(this->data2).quadrupole;
      pMVar26 = &pEVar1->quadrupole;
      lVar28 = 0;
      do {
        lVar32 = 0;
        do {
          (pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar32]
               = *(double *)
                  ((long)(pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + lVar32 * 8);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 3);
        lVar28 = lVar28 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
        pMVar26 = (Mat3x3d *)
                  ((long)(pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 0x18);
      } while (lVar28 != 3);
    }
    bVar19 = (this->data2).is_Dipole;
    bVar20 = (this->data2).is_Quadrupole;
    bVar21 = (this->data2).is_Fluctuating;
    this->b_is_Charge = (this->data2).is_Charge;
    this->b_is_Dipole = bVar19;
    this->b_is_Quadrupole = bVar20;
    this->b_is_Fluctuating = bVar21;
    this->b_uses_SlaterIntra = (this->data2).uses_SlaterIntramolecular;
  }
  __s = &this->U;
  t = &idat->rij;
  memset(__s,0,0xf8);
  dVar11 = 1.0 / idat->rij;
  this->ri = dVar11;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar28 = 1;
  do {
    local_158[lVar28 + 3] = (idat->d).super_Vector<double,_3U>.data_[lVar28 + -1] * dVar11;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 4);
  (this->rhat).super_Vector<double,_3U>.data_[2] = local_138[2];
  (this->rhat).super_Vector<double,_3U>.data_[0] = local_138[0];
  (this->rhat).super_Vector<double,_3U>.data_[1] = local_138[1];
  if (((this->a_uses_SlaterIntra != false) || (this->b_uses_SlaterIntra == true)) &&
     (idat->excluded == true)) {
    piVar7 = (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (undefined8 *)
             (*(long *)&(this->Jij).
                        super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar7[idat->atid1]].
                        super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                        ._M_impl.super__Vector_impl_data + (long)piVar7[idat->atid2] * 0x10);
    (this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 1));
  }
  if ((this->a_is_Charge != false) || (this->b_is_Charge == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v01s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v01,&this->dv01);
  }
  if ((this->a_is_Dipole != false) || (this->b_is_Dipole == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v11s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v11,&this->dv11);
    this->v11or = this->ri * this->v11;
  }
  if (((this->a_is_Quadrupole != false) || (this->b_is_Quadrupole != false)) ||
     ((this->a_is_Dipole == true && (this->b_is_Dipole == true)))) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v21s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v21,&this->dv21);
    CubicSpline::getValueAndDerivativeAt
              ((this->v22s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v22,&this->dv22);
    this->v22or = this->ri * this->v22;
  }
  if (((this->a_is_Dipole == true) && (this->b_is_Quadrupole != false)) ||
     ((this->b_is_Dipole == true && (this->a_is_Quadrupole == true)))) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v31s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v31,&this->dv31);
    CubicSpline::getValueAndDerivativeAt
              ((this->v32s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v32,&this->dv32);
    this->v31or = this->ri * this->v31;
    this->v32or = this->v32 * this->ri;
  }
  if ((this->a_is_Quadrupole == true) && (this->b_is_Quadrupole == true)) {
    CubicSpline::getValueAndDerivativeAt
              ((this->v41s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v41,&this->dv41);
    CubicSpline::getValueAndDerivativeAt
              ((this->v42s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v42,&this->dv42);
    CubicSpline::getValueAndDerivativeAt
              ((this->v43s).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&this->v43,&this->dv43);
    this->v42or = this->ri * this->v42;
    this->v43or = this->v43 * this->ri;
  }
  if (this->a_is_Charge == true) {
    dVar11 = (this->data1).fixedCharge;
    this->C_a = dVar11;
    if (this->a_is_Fluctuating == true) {
      this->C_a = dVar11 + idat->flucQ1;
    }
    if (idat->excluded == true) {
      idat->skippedCharge2 = this->C_a + idat->skippedCharge2;
    }
    else {
      dVar35 = this->C_a * this->pre11_;
      dVar11 = this->dv01;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar11 * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Eb).super_Vector<double,_3U>.data_[lVar28] =
             (this->Eb).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->Pb = dVar35 * this->v01 + this->Pb;
    }
  }
  if (this->a_is_Dipole == true) {
    dVar11 = 0.0;
    lVar28 = 0;
    do {
      dVar11 = dVar11 + (this->rhat).super_Vector<double,_3U>.data_[lVar28] *
                        (idat->D_1).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    this->rdDa = dVar11;
    dVar35 = (idat->D_1).super_Vector<double,_3U>.data_[0];
    dVar37 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar36 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar38 = (idat->D_1).super_Vector<double,_3U>.data_[1];
    dVar39 = (idat->D_1).super_Vector<double,_3U>.data_[2];
    (this->rxDa).super_Vector<double,_3U>.data_[0] = dVar39 * dVar4 - dVar36 * dVar38;
    (this->rxDa).super_Vector<double,_3U>.data_[1] = dVar35 * dVar36 - dVar37 * dVar39;
    (this->rxDa).super_Vector<double,_3U>.data_[2] = dVar37 * dVar38 - dVar35 * dVar4;
    if (idat->excluded == false) {
      dVar35 = this->pre12_;
      dVar37 = this->dv11;
      dVar4 = this->v11or;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * (dVar37 - dVar4) * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_1).super_Vector<double,_3U>.data_[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_e8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Eb).super_Vector<double,_3U>.data_[lVar28] =
             (this->Eb).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->Pb = dVar35 * this->v11 * dVar11 + this->Pb;
    }
  }
  if (this->a_is_Quadrupole == true) {
    pMVar27 = &idat->Q_1;
    dVar11 = (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
             + (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
               [1] + (idat->Q_1).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[2][2];
    this->trQa = dVar11;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    pMVar26 = pMVar27;
    do {
      dVar35 = local_158[lVar28 + 4];
      lVar32 = 0;
      do {
        dVar35 = dVar35 + (pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar32] * (this->rhat).super_Vector<double,_3U>.data_[lVar32];
        lVar32 = lVar32 + 1;
      } while (lVar32 != 3);
      local_158[lVar28 + 4] = dVar35;
      lVar28 = lVar28 + 1;
      pMVar26 = (Mat3x3d *)
                ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar28 != 3);
    (this->Qar).super_Vector<double,_3U>.data_[2] = local_138[2];
    (this->Qar).super_Vector<double,_3U>.data_[0] = local_138[0];
    (this->Qar).super_Vector<double,_3U>.data_[1] = local_138[1];
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      dVar35 = local_158[lVar28 + 4];
      lVar32 = 0;
      pMVar26 = pMVar27;
      do {
        dVar35 = dVar35 + (this->rhat).super_Vector<double,_3U>.data_[lVar32] *
                          (pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar32 = lVar32 + 1;
        pMVar26 = (Mat3x3d *)
                  ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar32 != 3);
      local_158[lVar28 + 4] = dVar35;
      lVar28 = lVar28 + 1;
      pMVar27 = (Mat3x3d *)
                ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar28 != 3);
    (this->rQa).super_Vector<double,_3U>.data_[2] = local_138[2];
    (this->rQa).super_Vector<double,_3U>.data_[0] = local_138[0];
    (this->rQa).super_Vector<double,_3U>.data_[1] = local_138[1];
    dVar35 = 0.0;
    lVar28 = 0;
    do {
      dVar35 = dVar35 + (this->rhat).super_Vector<double,_3U>.data_[lVar28] *
                        (this->Qar).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    this->rdQar = dVar35;
    dVar37 = (this->Qar).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar36 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar38 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar39 = (this->Qar).super_Vector<double,_3U>.data_[1];
    dVar5 = (this->Qar).super_Vector<double,_3U>.data_[2];
    (this->rxQar).super_Vector<double,_3U>.data_[0] = dVar5 * dVar36 - dVar38 * dVar39;
    (this->rxQar).super_Vector<double,_3U>.data_[1] = dVar37 * dVar38 - dVar4 * dVar5;
    (this->rxQar).super_Vector<double,_3U>.data_[2] = dVar4 * dVar39 - dVar37 * dVar36;
    if (idat->excluded == false) {
      dVar37 = this->pre14_;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->dv21;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        dVar4 = (this->Qar).super_Vector<double,_3U>.data_[lVar28];
        local_88[lVar28] = dVar4 + dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->v22or;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar28 = 0;
      do {
        local_a8[lVar28] = local_88[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_a8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      lVar28 = 0;
      do {
        local_48[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar36 = this->dv22;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar28 = 0;
      do {
        local_68[lVar28] = local_48[lVar28] * (dVar36 - (dVar4 + dVar4));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_68[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Eb).super_Vector<double,_3U>.data_[lVar28] =
             (this->Eb).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->Pb = dVar37 * (dVar11 * this->v21 + dVar35 * this->v22) + this->Pb;
    }
  }
  if (this->b_is_Charge == true) {
    dVar11 = (this->data2).fixedCharge;
    this->C_b = dVar11;
    if (this->b_is_Fluctuating == true) {
      this->C_b = dVar11 + idat->flucQ2;
    }
    if (idat->excluded == true) {
      idat->skippedCharge1 = this->C_b + idat->skippedCharge1;
    }
    else {
      dVar35 = this->C_b * this->pre11_;
      dVar11 = this->dv01;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar11 * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ea).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ea).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->Pa = dVar35 * this->v01 + this->Pa;
    }
  }
  if (this->b_is_Dipole == true) {
    dVar11 = 0.0;
    lVar28 = 0;
    do {
      dVar11 = dVar11 + (this->rhat).super_Vector<double,_3U>.data_[lVar28] *
                        (idat->D_2).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    this->rdDb = dVar11;
    dVar35 = (idat->D_2).super_Vector<double,_3U>.data_[0];
    dVar37 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar36 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar38 = (idat->D_2).super_Vector<double,_3U>.data_[1];
    dVar39 = (idat->D_2).super_Vector<double,_3U>.data_[2];
    (this->rxDb).super_Vector<double,_3U>.data_[0] = dVar39 * dVar4 - dVar36 * dVar38;
    (this->rxDb).super_Vector<double,_3U>.data_[1] = dVar35 * dVar36 - dVar37 * dVar39;
    (this->rxDb).super_Vector<double,_3U>.data_[2] = dVar37 * dVar38 - dVar35 * dVar4;
    if (idat->excluded == false) {
      dVar35 = this->pre12_;
      dVar37 = this->dv11;
      dVar4 = this->v11or;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * (dVar37 - dVar4) * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_2).super_Vector<double,_3U>.data_[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_e8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ea).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ea).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->Pa = dVar35 * this->v11 * dVar11 + this->Pa;
    }
  }
  if (this->b_is_Quadrupole == true) {
    pMVar27 = &idat->Q_2;
    dVar11 = (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
             + (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
               [1] + (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[2][2];
    this->trQb = dVar11;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    pMVar26 = pMVar27;
    do {
      dVar35 = local_158[lVar28 + 4];
      lVar32 = 0;
      do {
        dVar35 = dVar35 + (pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar32] * (this->rhat).super_Vector<double,_3U>.data_[lVar32];
        lVar32 = lVar32 + 1;
      } while (lVar32 != 3);
      local_158[lVar28 + 4] = dVar35;
      lVar28 = lVar28 + 1;
      pMVar26 = (Mat3x3d *)
                ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar28 != 3);
    (this->Qbr).super_Vector<double,_3U>.data_[2] = local_138[2];
    (this->Qbr).super_Vector<double,_3U>.data_[0] = local_138[0];
    (this->Qbr).super_Vector<double,_3U>.data_[1] = local_138[1];
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      dVar35 = local_158[lVar28 + 4];
      lVar32 = 0;
      pMVar26 = pMVar27;
      do {
        dVar35 = dVar35 + (this->rhat).super_Vector<double,_3U>.data_[lVar32] *
                          (pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar32 = lVar32 + 1;
        pMVar26 = (Mat3x3d *)
                  ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar32 != 3);
      local_158[lVar28 + 4] = dVar35;
      lVar28 = lVar28 + 1;
      pMVar27 = (Mat3x3d *)
                ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar28 != 3);
    (this->rQb).super_Vector<double,_3U>.data_[2] = local_138[2];
    (this->rQb).super_Vector<double,_3U>.data_[0] = local_138[0];
    (this->rQb).super_Vector<double,_3U>.data_[1] = local_138[1];
    dVar35 = 0.0;
    lVar28 = 0;
    do {
      dVar35 = dVar35 + (this->rhat).super_Vector<double,_3U>.data_[lVar28] *
                        (this->Qbr).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    this->rdQbr = dVar35;
    dVar37 = (this->Qbr).super_Vector<double,_3U>.data_[0];
    dVar4 = (this->rhat).super_Vector<double,_3U>.data_[0];
    dVar36 = (this->rhat).super_Vector<double,_3U>.data_[1];
    dVar38 = (this->rhat).super_Vector<double,_3U>.data_[2];
    dVar39 = (this->Qbr).super_Vector<double,_3U>.data_[1];
    dVar5 = (this->Qbr).super_Vector<double,_3U>.data_[2];
    (this->rxQbr).super_Vector<double,_3U>.data_[0] = dVar5 * dVar36 - dVar38 * dVar39;
    (this->rxQbr).super_Vector<double,_3U>.data_[1] = dVar37 * dVar38 - dVar4 * dVar5;
    (this->rxQbr).super_Vector<double,_3U>.data_[2] = dVar4 * dVar39 - dVar37 * dVar36;
    if (idat->excluded == false) {
      dVar37 = this->pre14_;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->dv21;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        dVar4 = (this->Qbr).super_Vector<double,_3U>.data_[lVar28];
        local_88[lVar28] = dVar4 + dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->v22or;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar28 = 0;
      do {
        local_a8[lVar28] = local_88[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_a8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      lVar28 = 0;
      do {
        local_48[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar36 = this->dv22;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar28 = 0;
      do {
        local_68[lVar28] = local_48[lVar28] * (dVar36 - (dVar4 + dVar4));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_68[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ea).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ea).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->Pa = dVar37 * (dVar11 * this->v21 + dVar35 * this->v22) + this->Pa;
    }
  }
  if (this->a_is_Charge != true) goto LAB_00287973;
  if (this->b_is_Charge == true) {
    dVar11 = this->v01;
    dVar36 = this->pre11_ * idat->electroMult;
    this->pref = dVar36;
    dVar35 = this->C_a;
    dVar37 = this->C_b;
    dVar38 = dVar35 * dVar37 * dVar36;
    this->U = dVar38 * dVar11 + this->U;
    dVar4 = this->dv01;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar38 * dVar4;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
      dVar38 = this->preRF_ * dVar36 * dVar35 * dVar37 * idat->r2;
      this->rfContrib = dVar38;
      this->indirect_Pot = this->indirect_Pot + dVar38;
      dVar4 = this->ri;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * (dVar38 + dVar38) * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->indirect_F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->indirect_F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
    if (idat->excluded == true) {
      if ((this->a_uses_SlaterIntra != false) || (this->b_uses_SlaterIntra == true)) {
        dVar11 = CubicSpline::getValueAt
                           ((this->J).
                            super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,t);
        this->coulInt = dVar11;
        dVar36 = this->C_a;
        this->excluded_Pot = dVar36 * this->C_b * dVar11 + this->excluded_Pot;
        if (this->a_is_Fluctuating == true) {
          this->dUdCa = this->C_b * dVar11 + this->dUdCa;
        }
        if (this->b_is_Fluctuating == true) goto LAB_00287359;
      }
    }
    else {
      if (this->a_is_Fluctuating == true) {
        this->dUdCa = dVar37 * dVar36 * dVar11 + this->dUdCa;
      }
      if (this->b_is_Fluctuating == true) {
        dVar36 = dVar36 * dVar35;
LAB_00287359:
        this->dUdCb = dVar36 * dVar11 + this->dUdCb;
      }
    }
  }
  if (this->b_is_Dipole == true) {
    dVar38 = this->pre12_ * idat->electroMult;
    dVar11 = this->v11;
    this->pref = dVar38;
    dVar36 = this->C_a * dVar38;
    dVar39 = dVar36 * dVar11;
    dVar35 = this->rdDb;
    this->U = dVar39 * dVar35 + this->U;
    dVar37 = this->dv11;
    dVar4 = this->v11or;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28] =
           (this->rhat).super_Vector<double,_3U>.data_[lVar28] * (dVar37 - dVar4) * dVar35;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    lVar28 = 0;
    do {
      local_e8[lVar28] = (idat->D_2).super_Vector<double,_3U>.data_[lVar28] * dVar4;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    local_178[2] = 0.0;
    lVar28 = 0;
    do {
      local_178[lVar28] = local_158[lVar28] + local_e8[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = local_178[lVar28] * dVar36;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = (this->rxDb).super_Vector<double,_3U>.data_[lVar28] * dVar39;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    if (this->a_is_Fluctuating == true) {
      this->dUdCa = dVar38 * dVar11 * dVar35 + this->dUdCa;
    }
    if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
      dVar36 = dVar36 * this->preRF_;
      dVar11 = *t;
      dVar37 = (dVar36 + dVar36) * dVar11;
      this->rfContrib = dVar37;
      this->indirect_Pot = dVar35 * dVar37 + this->indirect_Pot;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = (idat->D_2).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] / dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->indirect_F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->indirect_F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = (this->rxDb).super_Vector<double,_3U>.data_[lVar28] * dVar36;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
  }
  if (this->b_is_Quadrupole == true) {
    dVar11 = this->v22;
    dVar36 = this->pre14_ * idat->electroMult;
    this->pref = dVar36;
    dVar39 = this->C_a * dVar36;
    dVar35 = this->trQb;
    dVar37 = this->rdQbr;
    dVar38 = this->v21 * dVar35 + dVar11 * dVar37;
    this->U = dVar39 * dVar38 + this->U;
    dVar4 = this->dv21;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar35 * dVar4;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_c8[2] = 0.0;
    lVar28 = 0;
    do {
      dVar35 = (this->Qbr).super_Vector<double,_3U>.data_[lVar28];
      local_c8[lVar28] = dVar35 + dVar35;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    dVar35 = this->v22or;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    lVar28 = 0;
    do {
      local_e8[lVar28] = local_c8[lVar28] * dVar35;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    local_178[2] = 0.0;
    lVar28 = 0;
    do {
      local_178[lVar28] = local_158[lVar28] + local_e8[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = local_178[lVar28] * dVar39;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    local_178[2] = 0.0;
    lVar28 = 0;
    do {
      local_178[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar37 * dVar39;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    dVar37 = this->dv22;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = local_178[lVar28] * (dVar37 - (dVar35 + dVar35));
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (this->F).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    local_178[2] = 0.0;
    lVar28 = 0;
    do {
      local_178[lVar28] = (this->rxQbr).super_Vector<double,_3U>.data_[lVar28] * (dVar39 + dVar39);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    if (this->a_is_Fluctuating == true) {
      this->dUdCa = dVar36 * dVar38 + this->dUdCa;
    }
  }
LAB_00287973:
  if (this->a_is_Dipole == true) {
    if (this->b_is_Charge == true) {
      dVar38 = this->pre12_ * idat->electroMult;
      dVar11 = this->v11;
      this->pref = dVar38;
      dVar35 = this->rdDa;
      dVar36 = this->C_b * dVar38;
      dVar39 = dVar36 * dVar11;
      this->U = this->U - dVar39 * dVar35;
      dVar37 = this->dv11;
      dVar4 = this->v11or;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * (dVar37 - dVar4) * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_1).super_Vector<double,_3U>.data_[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_e8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar36;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = (this->rxDa).super_Vector<double,_3U>.data_[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             (this->Ta).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      if (this->b_is_Fluctuating == true) {
        this->dUdCb = this->dUdCb - dVar11 * dVar38 * dVar35;
      }
      if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
        dVar36 = dVar36 * this->preRF_;
        dVar11 = *t;
        dVar37 = (dVar36 + dVar36) * dVar11;
        this->rfContrib = dVar37;
        this->indirect_Pot = this->indirect_Pot - dVar35 * dVar37;
        local_178[0] = 0.0;
        local_178[1] = 0.0;
        local_178[2] = 0.0;
        lVar28 = 0;
        do {
          local_178[lVar28] = (idat->D_1).super_Vector<double,_3U>.data_[lVar28] * dVar37;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        lVar28 = 0;
        do {
          local_158[lVar28 + 4] = local_178[lVar28] / dVar11;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        lVar28 = 0;
        do {
          (this->indirect_F).super_Vector<double,_3U>.data_[lVar28] =
               (this->indirect_F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        lVar28 = 0;
        do {
          local_158[lVar28 + 4] = (this->rxDa).super_Vector<double,_3U>.data_[lVar28] * dVar36;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        lVar28 = 0;
        do {
          (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar28] =
               (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
      }
    }
    if (this->b_is_Dipole == true) {
      dVar35 = this->pre22_ * idat->electroMult;
      this->pref = dVar35;
      dVar11 = 0.0;
      lVar28 = -0x18;
      do {
        dVar11 = dVar11 + *(double *)((long)(idat->D_2).super_Vector<double,_3U>.data_ + lVar28) *
                          *(double *)
                           ((long)(idat->Q_1).super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0] + lVar28);
        lVar28 = lVar28 + 8;
      } while (lVar28 != 0);
      this->DadDb = dVar11;
      dVar37 = (idat->D_2).super_Vector<double,_3U>.data_[0];
      dVar4 = (idat->D_1).super_Vector<double,_3U>.data_[0];
      dVar36 = (idat->D_1).super_Vector<double,_3U>.data_[1];
      dVar38 = (idat->D_1).super_Vector<double,_3U>.data_[2];
      dVar39 = (idat->D_2).super_Vector<double,_3U>.data_[1];
      dVar5 = (idat->D_2).super_Vector<double,_3U>.data_[2];
      (this->DaxDb).super_Vector<double,_3U>.data_[0] = dVar5 * dVar36 - dVar38 * dVar39;
      (this->DaxDb).super_Vector<double,_3U>.data_[1] = dVar37 * dVar38 - dVar4 * dVar5;
      (this->DaxDb).super_Vector<double,_3U>.data_[2] = dVar4 * dVar39 - dVar37 * dVar36;
      dVar37 = this->v21;
      dVar4 = this->v22;
      dVar36 = this->rdDa;
      dVar38 = this->rdDb;
      this->U = this->U - (dVar11 * dVar37 + dVar36 * dVar38 * dVar4) * dVar35;
      dVar39 = this->dv21;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar39 * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar39 = this->v22or;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar28 = 0;
      do {
        local_a8[lVar28] = (idat->D_1).super_Vector<double,_3U>.data_[lVar28] * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        local_88[lVar28] = (idat->D_2).super_Vector<double,_3U>.data_[lVar28] * dVar36;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = local_a8[lVar28] + local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_e8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar5 = this->dv22;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] *
             (dVar5 - (dVar39 + dVar39)) * dVar36 * dVar38 * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (this->rxDa).super_Vector<double,_3U>.data_[lVar28] * dVar38 * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] - local_e8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar28] * -dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (this->rxDb).super_Vector<double,_3U>.data_[lVar28] * dVar36 * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] - local_e8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      if ((this->summationMethod_ == esm_REACTION_FIELD) && (idat->excluded == true)) {
        dVar35 = -dVar35 * this->preRF_;
        dVar35 = dVar35 + dVar35;
        this->rfContrib = dVar35;
        this->indirect_Pot = dVar11 * dVar35 + this->indirect_Pot;
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        lVar28 = 0;
        do {
          local_158[lVar28 + 4] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar28] * dVar35;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        lVar28 = 0;
        do {
          (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar28] =
               local_158[lVar28 + 4] + (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar28];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        dVar11 = this->rfContrib;
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        lVar28 = 0;
        do {
          local_158[lVar28 + 4] = (this->DaxDb).super_Vector<double,_3U>.data_[lVar28] * dVar11;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        lVar28 = 0;
        do {
          (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar28] =
               (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
      }
    }
    if (this->b_is_Quadrupole == true) {
      dVar11 = this->pre24_ * idat->electroMult;
      this->pref = dVar11;
      pMVar27 = &idat->Q_2;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        dVar35 = local_158[lVar28 + 4];
        lVar32 = 0;
        pMVar26 = pMVar27;
        do {
          dVar35 = dVar35 + (idat->D_1).super_Vector<double,_3U>.data_[lVar32] *
                            (pMVar26->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          lVar32 = lVar32 + 1;
          pMVar26 = (Mat3x3d *)
                    ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar32 != 3);
        local_158[lVar28 + 4] = dVar35;
        lVar28 = lVar28 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar28 != 3);
      (this->DadQb).super_Vector<double,_3U>.data_[2] = local_138[2];
      (this->DadQb).super_Vector<double,_3U>.data_[0] = local_138[0];
      (this->DadQb).super_Vector<double,_3U>.data_[1] = local_138[1];
      dVar35 = 0.0;
      lVar28 = 0;
      do {
        dVar35 = dVar35 + (idat->D_1).super_Vector<double,_3U>.data_[lVar28] *
                          (this->Qbr).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->DadQbr = dVar35;
      dVar37 = (this->Qbr).super_Vector<double,_3U>.data_[0];
      dVar4 = (idat->D_1).super_Vector<double,_3U>.data_[0];
      dVar36 = (idat->D_1).super_Vector<double,_3U>.data_[1];
      dVar38 = (idat->D_1).super_Vector<double,_3U>.data_[2];
      dVar39 = (this->Qbr).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->Qbr).super_Vector<double,_3U>.data_[2];
      (this->DaxQbr).super_Vector<double,_3U>.data_[0] = dVar5 * dVar36 - dVar38 * dVar39;
      (this->DaxQbr).super_Vector<double,_3U>.data_[1] = dVar37 * dVar38 - dVar4 * dVar5;
      (this->DaxQbr).super_Vector<double,_3U>.data_[2] = dVar4 * dVar39 - dVar37 * dVar36;
      dVar37 = this->trQb;
      dVar4 = this->rdDa;
      dVar39 = dVar37 * dVar4 + dVar35 + dVar35;
      dVar35 = this->v31;
      dVar36 = this->v32;
      dVar38 = this->rdQbr;
      this->U = this->U - (dVar39 * dVar35 + dVar4 * dVar38 * dVar36) * dVar11;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_1).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        dVar5 = (this->DadQb).super_Vector<double,_3U>.data_[lVar28];
        local_c8[lVar28] = dVar5 + dVar5;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar5 = this->v31or;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar5;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar6 = this->dv31;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] * (dVar6 - dVar5) * dVar39 * dVar11
        ;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_1).super_Vector<double,_3U>.data_[lVar28] * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rQb).super_Vector<double,_3U>.data_[lVar28] * (dVar4 + dVar4);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar39 = this->v32or;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar4 * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->dv32;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * (dVar39 * -3.0 + dVar4);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             (this->F).super_Vector<double,_3U>.data_[lVar28] - local_158[lVar28 + 4];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rxDa).super_Vector<double,_3U>.data_[lVar28] * -dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar28 = 0;
      do {
        dVar37 = (this->DaxQbr).super_Vector<double,_3U>.data_[lVar28];
        local_a8[lVar28] = dVar37 + dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] + local_a8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar28 = 0;
      do {
        local_68[lVar28] = (this->rxDa).super_Vector<double,_3U>.data_[lVar28] * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        local_88[lVar28] = local_68[lVar28] * dVar36;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] - local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar11 = this->pref;
      lVar28 = 0;
      dVar35 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar37 = (this->DadQb).super_Vector<double,_3U>.data_[0];
      dVar4 = (this->DadQb).super_Vector<double,_3U>.data_[1];
      dVar36 = (this->DadQb).super_Vector<double,_3U>.data_[2];
      dVar38 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar39 = (this->rhat).super_Vector<double,_3U>.data_[2];
      local_a8[0] = dVar39 * dVar4 - dVar36 * dVar38;
      local_a8[1] = dVar35 * dVar36 - dVar37 * dVar39;
      local_a8[2] = dVar37 * dVar38 - dVar35 * dVar4;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      do {
        local_c8[lVar28] = local_a8[lVar28] + local_a8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        dVar35 = (this->DaxQbr).super_Vector<double,_3U>.data_[lVar28];
        local_88[lVar28] = dVar35 + dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] - local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->v31;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->rdDa;
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      lVar28 = 0;
      do {
        local_48[lVar28] = (this->rxQbr).super_Vector<double,_3U>.data_[lVar28] * (dVar35 + dVar35);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->v32;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar28 = 0;
      do {
        local_68[lVar28] = local_48[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] - local_68[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
  }
  if (this->a_is_Quadrupole == true) {
    if (this->b_is_Charge == true) {
      dVar4 = this->pre14_ * idat->electroMult;
      dVar11 = this->v22;
      this->pref = dVar4;
      dVar38 = this->C_b * dVar4;
      dVar35 = this->trQa;
      dVar37 = this->rdQar;
      dVar36 = this->v21 * dVar35 + dVar11 * dVar37;
      this->U = dVar38 * dVar36 + this->U;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->dv21;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar28 = 0;
      do {
        dVar35 = (this->Qar).super_Vector<double,_3U>.data_[lVar28];
        local_a8[lVar28] = dVar35 + dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->v22or;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = local_a8[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar37 * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->dv22;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * (dVar37 - (dVar35 + dVar35));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = (this->rxQar).super_Vector<double,_3U>.data_[lVar28] * (dVar38 + dVar38)
        ;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      if (this->b_is_Fluctuating == true) {
        this->dUdCb = dVar4 * dVar36 + this->dUdCb;
      }
    }
    if (this->b_is_Dipole == true) {
      dVar11 = this->pre24_ * idat->electroMult;
      this->pref = dVar11;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      pMVar27 = &idat->Q_1;
      do {
        dVar35 = local_158[lVar28 + 4];
        lVar32 = -0x18;
        pMVar26 = pMVar27;
        do {
          dVar35 = dVar35 + *(double *)
                             ((long)(idat->Q_1).super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar32) *
                            (pMVar26->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          pMVar26 = (Mat3x3d *)
                    ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
          lVar32 = lVar32 + 8;
        } while (lVar32 != 0);
        local_158[lVar28 + 4] = dVar35;
        lVar28 = lVar28 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar28 != 3);
      (this->DbdQa).super_Vector<double,_3U>.data_[2] = local_138[2];
      (this->DbdQa).super_Vector<double,_3U>.data_[0] = local_138[0];
      (this->DbdQa).super_Vector<double,_3U>.data_[1] = local_138[1];
      dVar35 = 0.0;
      lVar28 = 0;
      do {
        dVar35 = dVar35 + (idat->D_2).super_Vector<double,_3U>.data_[lVar28] *
                          (this->Qar).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      this->DbdQar = dVar35;
      dVar37 = (this->Qar).super_Vector<double,_3U>.data_[0];
      dVar4 = (idat->D_2).super_Vector<double,_3U>.data_[0];
      dVar36 = (idat->D_2).super_Vector<double,_3U>.data_[1];
      dVar38 = (idat->D_2).super_Vector<double,_3U>.data_[2];
      dVar39 = (this->Qar).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->Qar).super_Vector<double,_3U>.data_[2];
      (this->DbxQar).super_Vector<double,_3U>.data_[0] = dVar5 * dVar36 - dVar38 * dVar39;
      (this->DbxQar).super_Vector<double,_3U>.data_[1] = dVar37 * dVar38 - dVar4 * dVar5;
      (this->DbxQar).super_Vector<double,_3U>.data_[2] = dVar4 * dVar39 - dVar37 * dVar36;
      dVar37 = this->trQa;
      dVar4 = this->rdDb;
      dVar39 = dVar37 * dVar4 + dVar35 + dVar35;
      dVar35 = this->v31;
      dVar36 = this->rdQar;
      dVar38 = dVar4 * dVar36;
      this->U = (dVar39 * dVar35 + this->v32 * dVar38) * dVar11 + this->U;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_2).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        dVar37 = (this->DbdQa).super_Vector<double,_3U>.data_[lVar28];
        local_c8[lVar28] = dVar37 + dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->v31or;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar5 = this->dv31;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] =
             (this->rhat).super_Vector<double,_3U>.data_[lVar28] *
             (dVar5 - dVar37) * dVar39 * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (idat->D_2).super_Vector<double,_3U>.data_[lVar28] * dVar36;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rQa).super_Vector<double,_3U>.data_[lVar28] * (dVar4 + dVar4);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->v32or;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->dv32;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * (dVar37 * -3.0 + dVar4);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      dVar37 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar4 = (this->DbdQa).super_Vector<double,_3U>.data_[0];
      dVar36 = (this->DbdQa).super_Vector<double,_3U>.data_[1];
      dVar38 = (this->DbdQa).super_Vector<double,_3U>.data_[2];
      dVar39 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->rhat).super_Vector<double,_3U>.data_[2];
      local_a8[0] = dVar5 * dVar36 - dVar38 * dVar39;
      local_a8[1] = dVar37 * dVar38 - dVar4 * dVar5;
      local_a8[2] = dVar4 * dVar39 - dVar37 * dVar36;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      do {
        local_c8[lVar28] = local_a8[lVar28] * -2.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        dVar37 = (this->DbxQar).super_Vector<double,_3U>.data_[lVar28];
        local_88[lVar28] = dVar37 + dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] + local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->rdDb;
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      lVar28 = 0;
      do {
        local_48[lVar28] = (this->rxQar).super_Vector<double,_3U>.data_[lVar28] * (dVar35 + dVar35);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->v32;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar28 = 0;
      do {
        local_68[lVar28] = local_48[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_68[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar11 = this->pref;
      dVar37 = this->trQa;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rxDb).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      lVar28 = 0;
      do {
        dVar37 = (this->DbxQar).super_Vector<double,_3U>.data_[lVar28];
        local_a8[lVar28] = dVar37 + dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] - local_a8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->v31;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->rdQar;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar28 = 0;
      do {
        local_68[lVar28] = (this->rxDb).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      lVar28 = 0;
      do {
        local_88[lVar28] = local_68[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] + local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
    if (this->b_is_Quadrupole == true) {
      this->pref = this->pre44_ * idat->electroMult;
      pMVar27 = &idat->Q_1;
      local_138[6] = 0.0;
      local_138[7] = 0.0;
      local_138[4] = 0.0;
      local_138[5] = 0.0;
      local_138[2] = 0.0;
      local_138[3] = 0.0;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[8] = 0.0;
      lVar28 = 0;
      do {
        lVar32 = 0;
        pMVar26 = &idat->Q_2;
        do {
          dVar11 = local_158[lVar28 * 3 + lVar32 + 4];
          lVar34 = 0;
          pMVar31 = pMVar26;
          do {
            dVar11 = dVar11 + (pMVar27->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][lVar34] *
                              (pMVar31->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][0];
            lVar34 = lVar34 + 1;
            pMVar31 = (Mat3x3d *)
                      ((pMVar31->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 1);
          } while (lVar34 != 3);
          local_158[lVar28 * 3 + lVar32 + 4] = dVar11;
          lVar32 = lVar32 + 1;
          pMVar26 = (Mat3x3d *)
                    ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [0] + 1);
        } while (lVar32 != 3);
        lVar28 = lVar28 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar28 != 3);
      pMVar27 = &this->QaQb;
      lVar28 = 0;
      do {
        *(undefined8 *)
         ((long)(this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
         + lVar28 + 0x10) = *(undefined8 *)((long)local_158 + lVar28 + 0x30);
        uVar18 = *(undefined8 *)((long)local_158 + lVar28 + 0x28);
        puVar3 = (undefined8 *)
                 ((long)(pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar28);
        *puVar3 = *(undefined8 *)((long)local_158 + lVar28 + 0x20);
        puVar3[1] = uVar18;
        lVar28 = lVar28 + 0x18;
      } while (lVar28 != 0x48);
      dVar11 = (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [0] + (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[1][1] +
               (this->QaQb).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
               [2];
      this->trQaQb = dVar11;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      pMVar26 = pMVar27;
      do {
        dVar35 = local_158[lVar28 + 4];
        lVar32 = 0;
        pMVar31 = pMVar26;
        do {
          dVar35 = dVar35 + (this->rhat).super_Vector<double,_3U>.data_[lVar32] *
                            (pMVar31->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          lVar32 = lVar32 + 1;
          pMVar31 = (Mat3x3d *)
                    ((pMVar31->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar32 != 3);
        local_158[lVar28 + 4] = dVar35;
        lVar28 = lVar28 + 1;
        pMVar26 = (Mat3x3d *)
                  ((pMVar26->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar28 != 3);
      (this->rQaQb).super_Vector<double,_3U>.data_[2] = local_138[2];
      (this->rQaQb).super_Vector<double,_3U>.data_[0] = local_138[0];
      (this->rQaQb).super_Vector<double,_3U>.data_[1] = local_138[1];
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        dVar35 = local_158[lVar28 + 4];
        lVar32 = 0;
        do {
          dVar35 = dVar35 + (pMVar27->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][lVar32] *
                            (this->rhat).super_Vector<double,_3U>.data_[lVar32];
          lVar32 = lVar32 + 1;
        } while (lVar32 != 3);
        local_158[lVar28 + 4] = dVar35;
        lVar28 = lVar28 + 1;
        pMVar27 = (Mat3x3d *)
                  ((pMVar27->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar28 != 3);
      (this->QaQbr).super_Vector<double,_3U>.data_[2] = local_138[2];
      (this->QaQbr).super_Vector<double,_3U>.data_[0] = local_138[0];
      (this->QaQbr).super_Vector<double,_3U>.data_[1] = local_138[1];
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      padVar33 = (idat->Q_2).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                 2;
      uVar29 = 2;
      lVar28 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar29;
        uVar12 = SUB168(auVar9 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe;
        lVar32 = lVar28 + 1;
        lVar34 = lVar32;
        if (lVar32 == 3) {
          lVar34 = 0;
        }
        dVar35 = local_158[lVar28 + 4];
        lVar30 = 0;
        do {
          dVar35 = dVar35 + ((idat->Q_1).super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[lVar34][lVar30] *
                             *(double *)((long)padVar33 + lVar30 * 8 + uVar12 * -0x24) -
                            (idat->Q_2).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U>.data_[lVar34][lVar30] *
                            *(double *)((long)padVar33 + lVar30 * 8 + uVar12 * -0x24 + -0x48));
          lVar30 = lVar30 + 1;
        } while (lVar30 != 3);
        local_158[lVar28 + 4] = dVar35;
        padVar33 = padVar33 + 1;
        uVar29 = uVar29 + 1;
        lVar28 = lVar32;
      } while (lVar32 != 3);
      (this->QaxQb).super_Vector<double,_3U>.data_[2] = local_138[2];
      (this->QaxQb).super_Vector<double,_3U>.data_[0] = local_138[0];
      (this->QaxQb).super_Vector<double,_3U>.data_[1] = local_138[1];
      dVar35 = 0.0;
      lVar28 = -0x18;
      do {
        dVar35 = dVar35 + *(double *)((long)(this->rQb).super_Vector<double,_3U>.data_ + lVar28) *
                          *(double *)((long)(this->rQa).super_Vector<double,_3U>.data_ + lVar28);
        lVar28 = lVar28 + 8;
      } while (lVar28 != 0);
      this->rQaQbr = dVar35;
      dVar37 = (this->Qbr).super_Vector<double,_3U>.data_[0];
      dVar4 = (this->rQa).super_Vector<double,_3U>.data_[0];
      dVar36 = (this->rQa).super_Vector<double,_3U>.data_[1];
      dVar38 = (this->rQa).super_Vector<double,_3U>.data_[2];
      dVar39 = (this->Qbr).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->Qbr).super_Vector<double,_3U>.data_[2];
      (this->rQaxQbr).super_Vector<double,_3U>.data_[0] = dVar5 * dVar36 - dVar38 * dVar39;
      (this->rQaxQbr).super_Vector<double,_3U>.data_[1] = dVar37 * dVar38 - dVar4 * dVar5;
      (this->rQaxQbr).super_Vector<double,_3U>.data_[2] = dVar4 * dVar39 - dVar37 * dVar36;
      dVar37 = this->pref;
      dVar4 = this->trQa;
      dVar36 = this->trQb;
      dVar39 = dVar4 * dVar36 + dVar11 + dVar11;
      dVar11 = this->rdQbr;
      dVar38 = dVar35 * 4.0 + dVar4 * dVar11 + dVar36 * this->rdQar;
      dVar35 = this->rdQar * dVar11;
      this->U = dVar37 * dVar35 * this->v43 +
                dVar37 * dVar38 * this->v42 + dVar37 * dVar39 * this->v41 + this->U;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar39 = this->dv41;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar38;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar38 = this->dv42;
      dVar39 = this->v42or;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * (dVar38 - (dVar39 + dVar39));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->rhat).super_Vector<double,_3U>.data_[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->v43or;
      dVar38 = this->dv43;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * (dVar35 * -4.0 + dVar38);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (this->rQa).super_Vector<double,_3U>.data_[lVar28] * dVar36;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rQb).super_Vector<double,_3U>.data_[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * (dVar37 + dVar37);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] =
             (this->rQaQb).super_Vector<double,_3U>.data_[lVar28] +
             (this->QaQbr).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar37 * 4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar39;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = (this->rQa).super_Vector<double,_3U>.data_[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar11 = this->rdQar;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      lVar28 = 0;
      do {
        local_c8[lVar28] = (this->rQb).super_Vector<double,_3U>.data_[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_c8[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * (dVar37 + dVar37);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->F).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->F).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar11 = this->pref;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->QaxQb).super_Vector<double,_3U>.data_[lVar28] * -4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar35 = this->v41;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->trQb;
      lVar28 = 0;
      dVar38 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar39 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar4 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar36 = (this->rQa).super_Vector<double,_3U>.data_[0];
      dVar5 = (this->rQa).super_Vector<double,_3U>.data_[1];
      dVar6 = (this->rQa).super_Vector<double,_3U>.data_[2];
      local_a8[0] = dVar5 * dVar39 - dVar6 * dVar38;
      local_a8[1] = dVar6 * dVar4 - dVar36 * dVar39;
      local_a8[2] = dVar36 * dVar38 - dVar4 * dVar5;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      do {
        local_c8[lVar28] = local_a8[lVar28] * dVar37 * -2.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      dVar37 = (this->QaQbr).super_Vector<double,_3U>.data_[0];
      dVar36 = (this->QaQbr).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->QaQbr).super_Vector<double,_3U>.data_[2];
      local_68[0] = dVar38 * dVar5 - dVar39 * dVar36;
      local_68[1] = dVar39 * dVar37 - dVar4 * dVar5;
      local_68[2] = dVar4 * dVar36 - dVar38 * dVar37;
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      do {
        local_88[lVar28] = local_68[lVar28] * 4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] + local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      lVar28 = 0;
      do {
        local_48[lVar28] = (this->rQaxQbr).super_Vector<double,_3U>.data_[lVar28] * 4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] - local_48[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar37 = this->v42;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      dVar4 = (this->Qar).super_Vector<double,_3U>.data_[0];
      dVar36 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar38 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar39 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar5 = (this->Qar).super_Vector<double,_3U>.data_[1];
      dVar6 = (this->Qar).super_Vector<double,_3U>.data_[2];
      local_e8[0] = dVar6 * dVar38 - dVar39 * dVar5;
      local_e8[1] = dVar4 * dVar39 - dVar36 * dVar6;
      local_e8[2] = dVar36 * dVar5 - dVar4 * dVar38;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      do {
        local_158[lVar28] = local_e8[lVar28] * (dVar11 + dVar11);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->rdQbr;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar4 = this->v43;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Ta).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Ta).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = (this->QaxQb).super_Vector<double,_3U>.data_[lVar28] * 4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar11 = this->trQa;
      dVar35 = this->pref;
      lVar28 = 0;
      dVar39 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar36 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar38 = (this->rQb).super_Vector<double,_3U>.data_[0];
      dVar6 = (this->rQb).super_Vector<double,_3U>.data_[1];
      dVar13 = (this->rQb).super_Vector<double,_3U>.data_[2];
      local_a8[0] = dVar6 * dVar5 - dVar13 * dVar39;
      local_a8[1] = dVar13 * dVar36 - dVar38 * dVar5;
      local_a8[2] = dVar38 * dVar39 - dVar36 * dVar6;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      do {
        local_c8[lVar28] = local_a8[lVar28] * dVar11 * -2.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      dVar11 = (this->rQaQb).super_Vector<double,_3U>.data_[0];
      dVar38 = (this->rQaQb).super_Vector<double,_3U>.data_[1];
      dVar6 = (this->rQaQb).super_Vector<double,_3U>.data_[2];
      local_68[0] = dVar5 * dVar38 - dVar39 * dVar6;
      local_68[1] = dVar36 * dVar6 - dVar5 * dVar11;
      local_68[2] = dVar39 * dVar11 - dVar36 * dVar38;
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
      do {
        local_88[lVar28] = local_68[lVar28] * 4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      lVar28 = 0;
      do {
        local_e8[lVar28] = local_c8[lVar28] - local_88[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      lVar28 = 0;
      do {
        local_48[lVar28] = (this->rQaxQbr).super_Vector<double,_3U>.data_[lVar28] * 4.0;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28] = local_e8[lVar28] + local_48[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar37;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      dVar11 = (this->Qbr).super_Vector<double,_3U>.data_[0];
      dVar37 = (this->rhat).super_Vector<double,_3U>.data_[0];
      dVar36 = (this->rhat).super_Vector<double,_3U>.data_[1];
      dVar38 = (this->rhat).super_Vector<double,_3U>.data_[2];
      dVar39 = (this->Qbr).super_Vector<double,_3U>.data_[1];
      dVar5 = (this->Qbr).super_Vector<double,_3U>.data_[2];
      local_e8[0] = dVar5 * dVar36 - dVar38 * dVar39;
      local_e8[1] = dVar11 * dVar38 - dVar37 * dVar5;
      local_e8[2] = dVar37 * dVar39 - dVar11 * dVar36;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      local_158[2] = 0.0;
      do {
        local_158[lVar28] = local_e8[lVar28] * (dVar35 + dVar35);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      dVar11 = this->rdQar;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_178[2] = 0.0;
      lVar28 = 0;
      do {
        local_178[lVar28] = local_158[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = local_178[lVar28] * dVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (this->Tb).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (this->Tb).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
  }
  if (idat->doElectricField == true) {
    dVar11 = idat->electroMult;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = (this->Ea).super_Vector<double,_3U>.data_[lVar28] * dVar11;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (idat->eField1).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (idat->eField1).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = (this->Eb).super_Vector<double,_3U>.data_[lVar28] * dVar11;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (idat->eField2).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (idat->eField2).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
  }
  if (idat->doSitePotential == true) {
    dVar11 = idat->electroMult * this->Pa + idat->sPot1;
    dVar35 = idat->electroMult * this->Pb + idat->sPot2;
    auVar10._8_4_ = SUB84(dVar35,0);
    auVar10._0_8_ = dVar11;
    auVar10._12_4_ = (int)((ulong)dVar35 >> 0x20);
    idat->sPot1 = dVar11;
    idat->sPot2 = (RealType)auVar10._8_8_;
  }
  if (this->a_is_Fluctuating == true) {
    idat->dVdFQ1 = this->dUdCa * idat->sw + idat->dVdFQ1;
  }
  if (this->b_is_Fluctuating == true) {
    idat->dVdFQ2 = this->dUdCb * idat->sw + idat->dVdFQ2;
  }
  if (idat->excluded == false) {
    dVar11 = *__s;
    idat->vpair = idat->vpair + dVar11;
    dVar35 = idat->sw;
    (idat->pot).data_[2] = dVar11 * dVar35 + (idat->pot).data_[2];
    if (idat->isSelected == true) {
      (idat->selePot).data_[2] = *__s * dVar35 + (idat->selePot).data_[2];
    }
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = (this->F).super_Vector<double,_3U>.data_[lVar28] * dVar35;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (idat->f1).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    if ((this->a_is_Dipole != false) || (this->a_is_Quadrupole == true)) {
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = (this->Ta).super_Vector<double,_3U>.data_[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (idat->t1).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (idat->t1).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
    if ((this->b_is_Dipole != false) || (this->b_is_Quadrupole == true)) {
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = (this->Tb).super_Vector<double,_3U>.data_[lVar28] * dVar35;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (idat->t2).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (idat->t2).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
  }
  else {
    idat->vpair = idat->vpair + this->indirect_Pot;
    (idat->excludedPot).data_[2] = this->excluded_Pot + (idat->excludedPot).data_[2];
    dVar11 = idat->sw;
    (idat->pot).data_[2] = this->indirect_Pot * dVar11 + (idat->pot).data_[2];
    if (idat->isSelected == true) {
      (idat->selePot).data_[2] = this->indirect_Pot * dVar11 + (idat->selePot).data_[2];
    }
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar28 = 0;
    do {
      local_158[lVar28 + 4] = (this->indirect_F).super_Vector<double,_3U>.data_[lVar28] * dVar11;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    lVar28 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar28] =
           local_158[lVar28 + 4] + (idat->f1).super_Vector<double,_3U>.data_[lVar28];
      lVar28 = lVar28 + 1;
    } while (lVar28 != 3);
    if ((this->a_is_Dipole != false) || (this->a_is_Quadrupole == true)) {
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = (this->indirect_Ta).super_Vector<double,_3U>.data_[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (idat->t1).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (idat->t1).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
    if ((this->b_is_Dipole != false) || (this->b_is_Quadrupole == true)) {
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      local_138[2] = 0.0;
      lVar28 = 0;
      do {
        local_158[lVar28 + 4] = (this->indirect_Tb).super_Vector<double,_3U>.data_[lVar28] * dVar11;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
      lVar28 = 0;
      do {
        (idat->t2).super_Vector<double,_3U>.data_[lVar28] =
             local_158[lVar28 + 4] + (idat->t2).super_Vector<double,_3U>.data_[lVar28];
        lVar28 = lVar28 + 1;
      } while (lVar28 != 3);
    }
  }
  return;
}

Assistant:

void Electrostatic::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (Etids[idat.atid1] != -1) {
      data1              = ElectrostaticMap[Etids[idat.atid1]];
      a_is_Charge        = data1.is_Charge;
      a_is_Dipole        = data1.is_Dipole;
      a_is_Quadrupole    = data1.is_Quadrupole;
      a_is_Fluctuating   = data1.is_Fluctuating;
      a_uses_SlaterIntra = data1.uses_SlaterIntramolecular;

    } else {
      a_is_Charge        = false;
      a_is_Dipole        = false;
      a_is_Quadrupole    = false;
      a_is_Fluctuating   = false;
      a_uses_SlaterIntra = false;
    }
    if (Etids[idat.atid2] != -1) {
      data2              = ElectrostaticMap[Etids[idat.atid2]];
      b_is_Charge        = data2.is_Charge;
      b_is_Dipole        = data2.is_Dipole;
      b_is_Quadrupole    = data2.is_Quadrupole;
      b_is_Fluctuating   = data2.is_Fluctuating;
      b_uses_SlaterIntra = data2.uses_SlaterIntramolecular;

    } else {
      b_is_Charge        = false;
      b_is_Dipole        = false;
      b_is_Quadrupole    = false;
      b_is_Fluctuating   = false;
      b_uses_SlaterIntra = false;
    }

    U = 0.0;      // Potential
    F.zero();     // Force
    Ta.zero();    // Torque on site a
    Tb.zero();    // Torque on site b
    Ea.zero();    // Electric field at site a
    Eb.zero();    // Electric field at site b
    Pa    = 0.0;  // Site potential at site a
    Pb    = 0.0;  // Site potential at site b
    dUdCa = 0.0;  // fluctuating charge force at site a
    dUdCb = 0.0;  // fluctuating charge force at site a

    // Indirect interactions mediated by the reaction field.
    indirect_Pot = 0.0;  // Potential
    indirect_F.zero();   // Force
    indirect_Ta.zero();  // Torque on site a
    indirect_Tb.zero();  // Torque on site b

    // Excluded potential that is still computed for fluctuating charges
    excluded_Pot = 0.0;

    // some variables we'll need independent of electrostatic type:

    ri   = 1.0 / idat.rij;
    rhat = idat.d * ri;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (((a_uses_SlaterIntra || b_uses_SlaterIntra) && idat.excluded)) {
      J = Jij[FQtids[idat.atid1]][FQtids[idat.atid2]];
    }

    // needed for fields (and forces):
    if (a_is_Charge || b_is_Charge) {
      v01s->getValueAndDerivativeAt(idat.rij, v01, dv01);
    }
    if (a_is_Dipole || b_is_Dipole) {
      v11s->getValueAndDerivativeAt(idat.rij, v11, dv11);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole || (a_is_Dipole && b_is_Dipole)) {
      v21s->getValueAndDerivativeAt(idat.rij, v21, dv21);
      v22s->getValueAndDerivativeAt(idat.rij, v22, dv22);
      v22or = ri * v22;
    }

    // needed for potentials (and forces and torques):
    if ((a_is_Dipole && b_is_Quadrupole) || (b_is_Dipole && a_is_Quadrupole)) {
      v31s->getValueAndDerivativeAt(idat.rij, v31, dv31);
      v32s->getValueAndDerivativeAt(idat.rij, v32, dv32);
      v31or = v31 * ri;
      v32or = v32 * ri;
    }
    if (a_is_Quadrupole && b_is_Quadrupole) {
      v41s->getValueAndDerivativeAt(idat.rij, v41, dv41);
      v42s->getValueAndDerivativeAt(idat.rij, v42, dv42);
      v43s->getValueAndDerivativeAt(idat.rij, v43, dv43);
      v42or = v42 * ri;
      v43or = v43 * ri;
    }

    // calculate the single-site contributions (fields, etc).

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += idat.flucQ1; }

      if (idat.excluded) {
        idat.skippedCharge2 += C_a;
      } else {
        // only do the field and site potentials if we're not excluded:
        Eb -= C_a * pre11_ * dv01 * rhat;
        Pb += C_a * pre11_ * v01;
      }
    }

    if (a_is_Dipole) {
      rdDa = dot(rhat, idat.D_1);
      rxDa = cross(rhat, idat.D_1);
      if (!idat.excluded) {
        Eb -= pre12_ * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Pb += pre12_ * v11 * rdDa;
      }
    }

    if (a_is_Quadrupole) {
      trQa  = idat.Q_1.trace();
      Qar   = idat.Q_1 * rhat;
      rQa   = rhat * idat.Q_1;
      rdQar = dot(rhat, Qar);
      rxQar = cross(rhat, Qar);
      if (!idat.excluded) {
        Eb -= pre14_ * (trQa * rhat * dv21 + 2.0 * Qar * v22or +
                        rdQar * rhat * (dv22 - 2.0 * v22or));
        Pb += pre14_ * (v21 * trQa + v22 * rdQar);
      }
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) { C_b += idat.flucQ2; }

      if (idat.excluded) {
        idat.skippedCharge1 += C_b;
      } else {
        // only do the field if we're not excluded:
        Ea += C_b * pre11_ * dv01 * rhat;
        Pa += C_b * pre11_ * v01;
      }
    }

    if (b_is_Dipole) {
      rdDb = dot(rhat, idat.D_2);
      rxDb = cross(rhat, idat.D_2);
      if (!idat.excluded) {
        Ea += pre12_ * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Pa += pre12_ * v11 * rdDb;
      }
    }

    if (b_is_Quadrupole) {
      trQb  = idat.Q_2.trace();
      Qbr   = idat.Q_2 * rhat;
      rQb   = rhat * idat.Q_2;
      rdQbr = dot(rhat, Qbr);
      rxQbr = cross(rhat, Qbr);
      if (!idat.excluded) {
        Ea += pre14_ * (trQb * rhat * dv21 + 2.0 * Qbr * v22or +
                        rdQbr * rhat * (dv22 - 2.0 * v22or));
        Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Charge) {
      if (b_is_Charge) {
        pref = pre11_ * idat.electroMult;
        U += C_a * C_b * pref * v01;
        F += C_a * C_b * pref * dv01 * rhat;

        // If this is an excluded pair, there are still indirect
        // interactions via the reaction field we must worry about:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = preRF_ * pref * C_a * C_b * idat.r2;
          indirect_Pot += rfContrib;
          indirect_F += rfContrib * 2.0 * ri * rhat;
        }

        // Fluctuating charge forces are handled via Coulomb integrals
        // for excluded pairs (i.e. those connected via bonds) and
        // with the standard charge-charge interaction otherwise.

        if (idat.excluded) {
          if (a_uses_SlaterIntra || b_uses_SlaterIntra) {
            coulInt = J->getValueAt(idat.rij);
            excluded_Pot += C_a * C_b * coulInt;
            if (a_is_Fluctuating) dUdCa += C_b * coulInt;
            if (b_is_Fluctuating) dUdCb += C_a * coulInt;
          }
        } else {
          if (a_is_Fluctuating) dUdCa += C_b * pref * v01;
          if (b_is_Fluctuating) dUdCb += C_a * pref * v01;
        }
      }

      if (b_is_Dipole) {
        pref = pre12_ * idat.electroMult;
        U += C_a * pref * v11 * rdDb;
        F += C_a * pref * ((dv11 - v11or) * rdDb * rhat + v11or * idat.D_2);
        Tb += C_a * pref * v11 * rxDb;

        if (a_is_Fluctuating) dUdCa += pref * v11 * rdDb;

        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated charge-dipole
        // interaction:

        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_a * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot += rfContrib * rdDb;
          indirect_F += rfContrib * idat.D_2 / idat.rij;
          indirect_Tb += C_a * pref * preRF_ * rxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref = pre14_ * idat.electroMult;
        U += C_a * pref * (v21 * trQb + v22 * rdQbr);
        F += C_a * pref * (trQb * dv21 * rhat + 2.0 * Qbr * v22or);
        F += C_a * pref * rdQbr * rhat * (dv22 - 2.0 * v22or);
        Tb += C_a * pref * 2.0 * rxQbr * v22;

        if (a_is_Fluctuating) dUdCa += pref * (v21 * trQb + v22 * rdQbr);
      }
    }

    if (a_is_Dipole) {
      if (b_is_Charge) {
        pref = pre12_ * idat.electroMult;

        U -= C_b * pref * v11 * rdDa;
        F -= C_b * pref * ((dv11 - v11or) * rdDa * rhat + v11or * idat.D_1);
        Ta -= C_b * pref * v11 * rxDa;

        if (b_is_Fluctuating) dUdCb -= pref * v11 * rdDa;

        // Even if we excluded this pair from direct interactions,
        // we still have the reaction-field-mediated charge-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = C_b * pref * preRF_ * 2.0 * idat.rij;
          indirect_Pot -= rfContrib * rdDa;
          indirect_F -= rfContrib * idat.D_1 / idat.rij;
          indirect_Ta -= C_b * pref * preRF_ * rxDa;
        }
      }

      if (b_is_Dipole) {
        pref  = pre22_ * idat.electroMult;
        DadDb = dot(idat.D_1, idat.D_2);
        DaxDb = cross(idat.D_1, idat.D_2);

        U -= pref * (DadDb * v21 + rdDa * rdDb * v22);
        F -= pref * (dv21 * DadDb * rhat +
                     v22or * (rdDb * idat.D_1 + rdDa * idat.D_2));
        F -= pref * (rdDa * rdDb) * (dv22 - 2.0 * v22or) * rhat;
        Ta += pref * (v21 * DaxDb - v22 * rdDb * rxDa);
        Tb += pref * (-v21 * DaxDb - v22 * rdDa * rxDb);
        // Even if we excluded this pair from direct interactions, we
        // still have the reaction-field-mediated dipole-dipole
        // interaction:
        if (summationMethod_ == esm_REACTION_FIELD && idat.excluded) {
          rfContrib = -pref * preRF_ * 2.0;
          indirect_Pot += rfContrib * DadDb;
          indirect_Ta += rfContrib * DaxDb;
          indirect_Tb -= rfContrib * DaxDb;
        }
      }

      if (b_is_Quadrupole) {
        pref   = pre24_ * idat.electroMult;
        DadQb  = idat.D_1 * idat.Q_2;
        DadQbr = dot(idat.D_1, Qbr);
        DaxQbr = cross(idat.D_1, Qbr);

        U -= pref * ((trQb * rdDa + 2.0 * DadQbr) * v31 + rdDa * rdQbr * v32);
        F -= pref * (trQb * idat.D_1 + 2.0 * DadQb) * v31or;
        F -= pref * (trQb * rdDa + 2.0 * DadQbr) * (dv31 - v31or) * rhat;
        F -= pref * (idat.D_1 * rdQbr + 2.0 * rdDa * rQb) * v32or;
        F -= pref * (rdDa * rdQbr * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-trQb * rxDa + 2.0 * DaxQbr) * v31 - rxDa * rdQbr * v32);
        Tb += pref * ((2.0 * cross(DadQb, rhat) - 2.0 * DaxQbr) * v31 -
                      2.0 * rdDa * rxQbr * v32);
      }
    }

    if (a_is_Quadrupole) {
      if (b_is_Charge) {
        pref = pre14_ * idat.electroMult;
        U += C_b * pref * (v21 * trQa + v22 * rdQar);
        F += C_b * pref * (trQa * rhat * dv21 + 2.0 * Qar * v22or);
        F += C_b * pref * rdQar * rhat * (dv22 - 2.0 * v22or);
        Ta += C_b * pref * 2.0 * rxQar * v22;

        if (b_is_Fluctuating) dUdCb += pref * (v21 * trQa + v22 * rdQar);
      }
      if (b_is_Dipole) {
        pref   = pre24_ * idat.electroMult;
        DbdQa  = idat.D_2 * idat.Q_1;
        DbdQar = dot(idat.D_2, Qar);
        DbxQar = cross(idat.D_2, Qar);

        U += pref * ((trQa * rdDb + 2.0 * DbdQar) * v31 + rdDb * rdQar * v32);
        F += pref * (trQa * idat.D_2 + 2.0 * DbdQa) * v31or;
        F += pref * (trQa * rdDb + 2.0 * DbdQar) * (dv31 - v31or) * rhat;
        F += pref * (idat.D_2 * rdQar + 2.0 * rdDb * rQa) * v32or;
        F += pref * (rdDb * rdQar * rhat * (dv32 - 3.0 * v32or));
        Ta += pref * ((-2.0 * cross(DbdQa, rhat) + 2.0 * DbxQar) * v31 +
                      2.0 * rdDb * rxQar * v32);
        Tb += pref * ((trQa * rxDb - 2.0 * DbxQar) * v31 + rxDb * rdQar * v32);
      }
      if (b_is_Quadrupole) {
        pref    = pre44_ * idat.electroMult;  // yes
        QaQb    = idat.Q_1 * idat.Q_2;
        trQaQb  = QaQb.trace();
        rQaQb   = rhat * QaQb;
        QaQbr   = QaQb * rhat;
        QaxQb   = mCross(idat.Q_1, idat.Q_2);
        rQaQbr  = dot(rQa, Qbr);
        rQaxQbr = cross(rQa, Qbr);

        U += pref * (trQa * trQb + 2.0 * trQaQb) * v41;
        U += pref * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) * v42;
        U += pref * (rdQar * rdQbr) * v43;

        F += pref * rhat * (trQa * trQb + 2.0 * trQaQb) * dv41;
        F += pref * rhat * (trQa * rdQbr + trQb * rdQar + 4.0 * rQaQbr) *
             (dv42 - 2.0 * v42or);
        F += pref * rhat * (rdQar * rdQbr) * (dv43 - 4.0 * v43or);

        F += pref * 2.0 * (trQb * rQa + trQa * rQb) * v42or;
        F += pref * 4.0 * (rQaQb + QaQbr) * v42or;
        F += pref * 2.0 * (rQa * rdQbr + rdQar * rQb) * v43or;

        Ta += pref * (-4.0 * QaxQb * v41);
        Ta += pref *
              (-2.0 * trQb * cross(rQa, rhat) + 4.0 * cross(rhat, QaQbr) -
               4.0 * rQaxQbr) *
              v42;
        Ta += pref * 2.0 * cross(rhat, Qar) * rdQbr * v43;

        Tb += pref * (+4.0 * QaxQb * v41);
        Tb += pref *
              (-2.0 * trQa * cross(rQb, rhat) - 4.0 * cross(rQaQb, rhat) +
               4.0 * rQaxQbr) *
              v42;
        // Possible replacement for line 2 above:
        //             + 4.0 * cross(rhat, QbQar)

        Tb += pref * 2.0 * cross(rhat, Qbr) * rdQar * v43;
      }
    }

    if (idat.doElectricField) {
      idat.eField1 += Ea * idat.electroMult;
      idat.eField2 += Eb * idat.electroMult;
    }

    if (idat.doSitePotential) {
      idat.sPot1 += Pa * idat.electroMult;
      idat.sPot2 += Pb * idat.electroMult;
    }

    if (a_is_Fluctuating) idat.dVdFQ1 += dUdCa * idat.sw;
    if (b_is_Fluctuating) idat.dVdFQ2 += dUdCb * idat.sw;

    if (!idat.excluded) {
      idat.vpair += U;
      idat.pot[ELECTROSTATIC_FAMILY] += U * idat.sw;
      if (idat.isSelected) idat.selePot[ELECTROSTATIC_FAMILY] += U * idat.sw;

      idat.f1 += F * idat.sw;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += Ta * idat.sw;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += Tb * idat.sw;

    } else {
      // only accumulate the forces and torques resulting from the
      // indirect reaction field terms.

      idat.vpair += indirect_Pot;
      idat.excludedPot[ELECTROSTATIC_FAMILY] += excluded_Pot;
      idat.pot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;
      if (idat.isSelected)
        idat.selePot[ELECTROSTATIC_FAMILY] += idat.sw * indirect_Pot;

      idat.f1 += idat.sw * indirect_F;

      if (a_is_Dipole || a_is_Quadrupole) idat.t1 += idat.sw * indirect_Ta;

      if (b_is_Dipole || b_is_Quadrupole) idat.t2 += idat.sw * indirect_Tb;
    }
    return;
  }